

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

QBackingStore * __thiscall QWidget::backingStore(QWidget *this)

{
  QBackingStore *pQVar1;
  QWidget *pQVar2;
  long lVar3;
  
  lVar3 = *(long *)&this->field_0x8;
  do {
    if (((*(long *)(lVar3 + 0x78) != 0) &&
        (lVar3 = *(long *)(*(long *)(lVar3 + 0x78) + 8), lVar3 != 0)) &&
       (pQVar1 = *(QBackingStore **)(lVar3 + 0x10), pQVar1 != (QBackingStore *)0x0)) {
      return pQVar1;
    }
    pQVar2 = this;
    if (((this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
      return (QBackingStore *)0x0;
    }
    do {
      this = pQVar2;
      lVar3 = *(long *)&this->field_0x8;
      if (*(QWidget **)(lVar3 + 0x10) == (QWidget *)0x0) break;
      pQVar2 = *(QWidget **)(lVar3 + 0x10);
    } while (((this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
              super_QFlagsStorage<Qt::WindowType>.i & 1) == 0);
  } while( true );
}

Assistant:

T *get() const noexcept
    {
        return d;
    }